

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_artifacts.cpp
# Opt level: O1

void __thiscall APowerup::Serialize(APowerup *this,FSerializer *arc)

{
  BYTE *pBVar1;
  int iVar2;
  undefined4 extraout_var;
  FSerializer *pFVar3;
  FName *pFVar4;
  FName *pFVar5;
  
  AInventory::Serialize(&this->super_AInventory,arc);
  if ((this->super_AInventory).super_AActor.super_DThinker.super_DObject.Class == (PClass *)0x0) {
    iVar2 = (**(this->super_AInventory).super_AActor.super_DThinker.super_DObject._vptr_DObject)
                      (this);
    (this->super_AInventory).super_AActor.super_DThinker.super_DObject.Class =
         (PClass *)CONCAT44(extraout_var,iVar2);
  }
  pBVar1 = ((this->super_AInventory).super_AActor.super_DThinker.super_DObject.Class)->Defaults;
  pFVar5 = (FName *)0x0;
  pFVar4 = (FName *)(pBVar1 + 0x4fc);
  if (save_full != false) {
    pFVar4 = pFVar5;
  }
  pFVar3 = ::Serialize(arc,"effecttics",(int32_t *)&(this->super_AInventory).field_0x4fc,
                       &pFVar4->Index);
  pFVar4 = (FName *)(pBVar1 + 0x500);
  if (save_full != false) {
    pFVar4 = pFVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"blendcolor",(uint32_t *)&this->BlendColor,(uint32_t *)pFVar4);
  pFVar4 = (FName *)(pBVar1 + 0x504);
  if (save_full != false) {
    pFVar4 = pFVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"mode",&(this->Mode).super_FName,pFVar4);
  pFVar4 = (FName *)(pBVar1 + 0x508);
  if (save_full != false) {
    pFVar4 = pFVar5;
  }
  ::Serialize(pFVar3,"strength",&this->Strength,(double *)pFVar4);
  return;
}

Assistant:

void APowerup::Serialize(FSerializer &arc)
{
	Super::Serialize (arc);
	auto def = (APowerup*)GetDefault();
	arc("effecttics", EffectTics, def->EffectTics)
		("blendcolor", BlendColor, def->BlendColor)
		("mode", Mode, def->Mode)
		("strength", Strength, def->Strength);
}